

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O2

void __thiscall
despot::MemoryPool<despot::RegDemoState>::~MemoryPool(MemoryPool<despot::RegDemoState> *this)

{
  DeleteAll(this);
  std::_Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>::~_Vector_base
            (&(this->freelist_).
              super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>);
  std::
  _Vector_base<despot::MemoryPool<despot::RegDemoState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::RegDemoState>::Chunk_*>_>
  ::~_Vector_base((_Vector_base<despot::MemoryPool<despot::RegDemoState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::RegDemoState>::Chunk_*>_>
                   *)this);
  return;
}

Assistant:

~MemoryPool() {
		DeleteAll();
	}